

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_cpio.c
# Opt level: O2

void test_format(_func_int_archive_ptr *set_format)

{
  int iVar1;
  mode_t mVar2;
  wchar_t wVar3;
  void *pvVar4;
  archive *paVar5;
  archive_entry *paVar6;
  time_t tVar7;
  long lVar8;
  char *pcVar9;
  la_ssize_t lVar10;
  la_int64_t lVar11;
  dev_t v2;
  ulong uVar12;
  archive_entry *local_90;
  void *local_88;
  size_t used;
  char filedata [64];
  
  pvVar4 = malloc(1000000);
  local_88 = pvVar4;
  paVar5 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L'*',(uint)(paVar5 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  iVar1 = (*set_format)(paVar5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L'+',(uint)(iVar1 == 0),"0 == (*set_format)(a)",paVar5);
  iVar1 = archive_write_add_filter_none(paVar5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L',',(uint)(iVar1 == 0),"0 == archive_write_add_filter_none(a)",paVar5);
  iVar1 = archive_write_open_memory(paVar5,pvVar4,1000000,&used);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L'-',(uint)(iVar1 == 0),
                   "0 == archive_write_open_memory(a, buff, buffsize, &used)",paVar5);
  paVar6 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L'2',(uint)(paVar6 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_set_mtime(paVar6,1,10);
  tVar7 = archive_entry_mtime(paVar6);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L'4',(uint)(tVar7 == 1),"1 == archive_entry_mtime(ae)",(void *)0x0);
  lVar8 = archive_entry_mtime_nsec(paVar6);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L'5',(uint)(lVar8 == 10),"10 == archive_entry_mtime_nsec(ae)",(void *)0x0);
  pcVar9 = strdup("file");
  archive_entry_copy_pathname(paVar6,pcVar9);
  free(pcVar9);
  pcVar9 = archive_entry_pathname(paVar6);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
             ,L':',"file","\"file\"",pcVar9,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  archive_entry_set_mode(paVar6,0x81ed);
  mVar2 = archive_entry_mode(paVar6);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L'<',(uint)(mVar2 == 0x81ed),"(S_IFREG | 0755) == archive_entry_mode(ae)",
                   (void *)0x0);
  archive_entry_set_size(paVar6,8);
  iVar1 = archive_write_header(paVar5,paVar6);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L'?',(uint)(iVar1 == 0),"0 == archive_write_header(a, ae)",paVar5);
  archive_entry_free(paVar6);
  lVar10 = archive_write_data(paVar5,"12345678",9);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L'A',(uint)(lVar10 == 8),"8 == archive_write_data(a, \"12345678\", 9)",paVar5);
  paVar6 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L'F',(uint)(paVar6 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_set_mtime(paVar6,1,10);
  tVar7 = archive_entry_mtime(paVar6);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L'H',(uint)(tVar7 == 1),"1 == archive_entry_mtime(ae)",(void *)0x0);
  lVar8 = archive_entry_mtime_nsec(paVar6);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L'I',(uint)(lVar8 == 10),"10 == archive_entry_mtime_nsec(ae)",(void *)0x0);
  pcVar9 = strdup("file2");
  archive_entry_copy_pathname(paVar6,pcVar9);
  free(pcVar9);
  pcVar9 = archive_entry_pathname(paVar6);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
             ,L'N',"file2","\"file2\"",pcVar9,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  archive_entry_set_mode(paVar6,0x81ed);
  mVar2 = archive_entry_mode(paVar6);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L'P',(uint)(mVar2 == 0x81ed),"(S_IFREG | 0755) == archive_entry_mode(ae)",
                   (void *)0x0);
  archive_entry_set_size(paVar6,4);
  iVar1 = archive_write_header(paVar5,paVar6);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L'S',(uint)(iVar1 == 0),"0 == archive_write_header(a, ae)",paVar5);
  archive_entry_free(paVar6);
  lVar10 = archive_write_data(paVar5,"1234",5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L'U',(uint)(lVar10 == 4),"4 == archive_write_data(a, \"1234\", 5)",paVar5);
  paVar6 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L'Z',(uint)(paVar6 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_copy_pathname(paVar6,"name");
  archive_entry_set_size(paVar6,0);
  archive_entry_set_filetype(paVar6,0x8000);
  iVar1 = archive_write_header(paVar5,paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                      ,L'^',0,"ARCHIVE_OK",(long)iVar1,"archive_write_header(a, ae)",(void *)0x0);
  pcVar9 = archive_error_string(paVar5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L'_',(uint)(pcVar9 == (char *)0x0),"archive_error_string(a) == NULL",(void *)0x0
                  );
  archive_entry_free(paVar6);
  paVar6 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L'e',(uint)(paVar6 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_copy_pathname(paVar6,"name");
  archive_entry_unset_size(paVar6);
  archive_entry_set_filetype(paVar6,0x8000);
  iVar1 = archive_write_header(paVar5,paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                      ,L'i',-0x19,"ARCHIVE_FAILED",(long)iVar1,"archive_write_header(a, ae)",
                      (void *)0x0);
  pcVar9 = archive_error_string(paVar5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L'j',(uint)(pcVar9 != (char *)0x0),"archive_error_string(a) != NULL",(void *)0x0
                  );
  archive_entry_free(paVar6);
  paVar6 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L'p',(uint)(paVar6 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_copy_pathname(paVar6,"name");
  archive_entry_set_size(paVar6,0);
  iVar1 = archive_write_header(paVar5,paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                      ,L's',-0x19,"ARCHIVE_FAILED",(long)iVar1,"archive_write_header(a, ae)",
                      (void *)0x0);
  pcVar9 = archive_error_string(paVar5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L't',(uint)(pcVar9 != (char *)0x0),"archive_error_string(a) != NULL",(void *)0x0
                  );
  archive_entry_free(paVar6);
  paVar6 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L'z',(uint)(paVar6 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_set_size(paVar6,0);
  archive_entry_set_filetype(paVar6,0x8000);
  iVar1 = archive_write_header(paVar5,paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                      ,L'}',-0x19,"ARCHIVE_FAILED",(long)iVar1,"archive_write_header(a, ae)",
                      (void *)0x0);
  pcVar9 = archive_error_string(paVar5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L'~',(uint)(pcVar9 != (char *)0x0),"archive_error_string(a) != NULL",(void *)0x0
                  );
  archive_entry_free(paVar6);
  paVar6 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L'\x84',(uint)(paVar6 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_set_mtime(paVar6,0xb,0x6e);
  archive_entry_copy_pathname(paVar6,"dir");
  archive_entry_set_mode(paVar6,0x41ed);
  archive_entry_set_size(paVar6,0x200);
  iVar1 = archive_write_header(paVar5,paVar6);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L'\x8a',(uint)(iVar1 == 0),"0 == archive_write_header(a, ae)",paVar5);
  lVar11 = archive_entry_size(paVar6);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                      ,L'\x8b',0,"0",lVar11,"archive_entry_size(ae)",(void *)0x0);
  archive_entry_free(paVar6);
  lVar10 = archive_write_data(paVar5,"12345678",9);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                      ,L'\x8d',0,"0",lVar10,"archive_write_data(a, \"12345678\", 9)",paVar5);
  paVar6 = archive_entry_new();
  local_90 = paVar6;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L'\x92',(uint)(paVar6 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(paVar6,"tty0");
  archive_entry_set_mode(paVar6,0x2180);
  archive_entry_set_size(paVar6,0);
  archive_entry_set_rdev(paVar6,0x400);
  iVar1 = archive_write_header(paVar5,paVar6);
  pvVar4 = local_88;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L'\x97',(uint)(iVar1 == 0),"0 == archive_write_header(a, ae)",paVar5);
  archive_entry_free(paVar6);
  iVar1 = archive_write_close(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                      ,L'\x9c',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar5);
  iVar1 = archive_write_free(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                      ,L'\x9d',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  uVar12 = 0x4f;
  do {
    if (uVar12 == 0x95) {
      wVar3 = L'\0';
      goto LAB_001e034f;
    }
    iVar1 = bcmp((void *)((long)pvVar4 + uVar12 + 1),"07070",5);
    uVar12 = uVar12 + 1;
  } while (iVar1 != 0);
  wVar3 = (wchar_t)(uVar12 < 0x96);
  *(undefined1 *)((long)pvVar4 + uVar12) = 0x58;
LAB_001e034f:
  failure("Unable to locate the second header for damage-recovery test.");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L'¯',wVar3,"damaged == 1",(void *)0x0);
  paVar5 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L'´',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_format_all(paVar5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L'µ',(uint)(iVar1 == 0),"0 == archive_read_support_format_all(a)",paVar5);
  iVar1 = archive_read_support_filter_all(paVar5);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L'¶',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",paVar5);
  iVar1 = archive_read_open_memory(paVar5,pvVar4,used);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                   ,L'·',(uint)(iVar1 == 0),"0 == archive_read_open_memory(a, buff, used)",paVar5);
  iVar1 = archive_read_next_header(paVar5,&local_90);
  wVar3 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                              ,L'¹',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",paVar5);
  if (wVar3 == L'\0') {
    archive_read_free(paVar5);
  }
  else {
    tVar7 = archive_entry_mtime(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                        ,L'¾',1,"1",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
    lVar8 = archive_entry_mtime_nsec(local_90);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                     ,L'À',(uint)(lVar8 == 0),"0 == archive_entry_mtime_nsec(ae)",(void *)0x0);
    tVar7 = archive_entry_atime(local_90);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                     ,L'Á',(uint)(tVar7 == 0),"0 == archive_entry_atime(ae)",(void *)0x0);
    tVar7 = archive_entry_ctime(local_90);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                     ,L'Â',(uint)(tVar7 == 0),"0 == archive_entry_ctime(ae)",(void *)0x0);
    pcVar9 = archive_entry_pathname(local_90);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
               ,L'Ã',"file","\"file\"",pcVar9,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    mVar2 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                        ,L'Ä',0x81ed,"(S_IFREG | 0755)",(ulong)mVar2,"archive_entry_mode(ae)",
                        (void *)0x0);
    lVar11 = archive_entry_size(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                        ,L'Å',8,"8",lVar11,"archive_entry_size(ae)",(void *)0x0);
    lVar10 = archive_read_data(paVar5,filedata,10);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                     ,L'Æ',(uint)(lVar10 == 8),"8 == archive_read_data(a, filedata, 10)",paVar5);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                        ,L'Ç',filedata,"filedata","12345678","\"12345678\"",8,"8",(void *)0x0);
    iVar1 = archive_read_next_header(paVar5,&local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                        ,L'Ñ',-0x14,"ARCHIVE_WARN",(long)iVar1,"archive_read_next_header(a, &ae)",
                        paVar5);
    pcVar9 = archive_entry_pathname(local_90);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
               ,L'Ò',"name","\"name\"",pcVar9,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    iVar1 = archive_read_next_header(paVar5,&local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                        ,L'×',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar5)
    ;
    tVar7 = archive_entry_mtime(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                        ,L'Ø',0xb,"11",tVar7,"archive_entry_mtime(ae)",(void *)0x0);
    lVar8 = archive_entry_mtime_nsec(local_90);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                     ,L'Ù',(uint)(lVar8 == 0),"0 == archive_entry_mtime_nsec(ae)",(void *)0x0);
    tVar7 = archive_entry_atime(local_90);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                     ,L'Ú',(uint)(tVar7 == 0),"0 == archive_entry_atime(ae)",(void *)0x0);
    tVar7 = archive_entry_ctime(local_90);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                     ,L'Û',(uint)(tVar7 == 0),"0 == archive_entry_ctime(ae)",(void *)0x0);
    pcVar9 = archive_entry_pathname(local_90);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
               ,L'Ü',"dir","\"dir\"",pcVar9,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    mVar2 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                        ,L'Ý',0x41ed,"(S_IFDIR | 0755)",(ulong)mVar2,"archive_entry_mode(ae)",
                        (void *)0x0);
    lVar11 = archive_entry_size(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                        ,L'Þ',0,"0",lVar11,"archive_entry_size(ae)",(void *)0x0);
    lVar10 = archive_read_data(paVar5,filedata,10);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                        ,L'ß',0,"0",lVar10,"archive_read_data(a, filedata, 10)",paVar5);
    iVar1 = archive_read_next_header(paVar5,&local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                        ,L'ä',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar5)
    ;
    pcVar9 = archive_entry_pathname(local_90);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
               ,L'å',"tty0","\"tty0\"",pcVar9,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
    mVar2 = archive_entry_mode(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                        ,L'æ',0x2180,"(S_IFCHR | 0600)",(ulong)mVar2,"archive_entry_mode(ae)",
                        (void *)0x0);
    lVar11 = archive_entry_size(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                        ,L'ç',0,"0",lVar11,"archive_entry_size(ae)",(void *)0x0);
    v2 = archive_entry_rdev(local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                        ,L'è',0x400,"1024",v2,"archive_entry_rdev(ae)",(void *)0x0);
    iVar1 = archive_read_next_header(paVar5,&local_90);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                        ,L'ë',1,"1",(long)iVar1,"archive_read_next_header(a, &ae)",paVar5);
    iVar1 = archive_read_close(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                        ,L'ì',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar5);
    iVar1 = archive_read_free(paVar5);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_cpio.c"
                        ,L'í',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
    free(pvVar4);
  }
  return;
}

Assistant:

static void
test_format(int	(*set_format)(struct archive *))
{
	char filedata[64];
	struct archive_entry *ae;
	struct archive *a;
	char *p;
	size_t used;
	size_t buffsize = 1000000;
	char *buff;
	int damaged = 0;

	buff = malloc(buffsize);

	/* Create a new archive in memory. */
	assert((a = archive_write_new()) != NULL);
	assertA(0 == (*set_format)(a));
	assertA(0 == archive_write_add_filter_none(a));
	assertA(0 == archive_write_open_memory(a, buff, buffsize, &used));

	/*
	 * Write a file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 10);
	assert(1 == archive_entry_mtime(ae));
	assert(10 == archive_entry_mtime_nsec(ae));
	p = strdup("file");
	archive_entry_copy_pathname(ae, p);
	strcpy(p, "XXXX");
	free(p);
	assertEqualString("file", archive_entry_pathname(ae));
	archive_entry_set_mode(ae, S_IFREG | 0755);
	assert((S_IFREG | 0755) == archive_entry_mode(ae));
	archive_entry_set_size(ae, 8);

	assertA(0 == archive_write_header(a, ae));
	archive_entry_free(ae);
	assertA(8 == archive_write_data(a, "12345678", 9));

	/*
	 * Write another file to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 1, 10);
	assert(1 == archive_entry_mtime(ae));
	assert(10 == archive_entry_mtime_nsec(ae));
	p = strdup("file2");
	archive_entry_copy_pathname(ae, p);
	strcpy(p, "XXXX");
	free(p);
	assertEqualString("file2", archive_entry_pathname(ae));
	archive_entry_set_mode(ae, S_IFREG | 0755);
	assert((S_IFREG | 0755) == archive_entry_mode(ae));
	archive_entry_set_size(ae, 4);

	assertA(0 == archive_write_header(a, ae));
	archive_entry_free(ae);
	assertA(4 == archive_write_data(a, "1234", 5));

	/*
	 * Write a file with a name, filetype, and size.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "name");
	archive_entry_set_size(ae, 0);
	archive_entry_set_filetype(ae, AE_IFREG);
	assertEqualInt(ARCHIVE_OK, archive_write_header(a, ae));
	assert(archive_error_string(a) == NULL);
	archive_entry_free(ae);

	/*
	 * Write a file with a name and filetype but no size.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "name");
	archive_entry_unset_size(ae);
	archive_entry_set_filetype(ae, AE_IFREG);
	assertEqualInt(ARCHIVE_FAILED, archive_write_header(a, ae));
	assert(archive_error_string(a) != NULL);
	archive_entry_free(ae);

	/*
	 * Write a file with a name and size but no filetype.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "name");
	archive_entry_set_size(ae, 0);
	assertEqualInt(ARCHIVE_FAILED, archive_write_header(a, ae));
	assert(archive_error_string(a) != NULL);
	archive_entry_free(ae);

	/*
	 * Write a file with a size and filetype but no name.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_size(ae, 0);
	archive_entry_set_filetype(ae, AE_IFREG);
	assertEqualInt(ARCHIVE_FAILED, archive_write_header(a, ae));
	assert(archive_error_string(a) != NULL);
	archive_entry_free(ae);

	/*
	 * Write a directory to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mtime(ae, 11, 110);
	archive_entry_copy_pathname(ae, "dir");
	archive_entry_set_mode(ae, S_IFDIR | 0755);
	archive_entry_set_size(ae, 512);

	assertA(0 == archive_write_header(a, ae));
	assertEqualInt(0, archive_entry_size(ae));
	archive_entry_free(ae);
	assertEqualIntA(a, 0, archive_write_data(a, "12345678", 9));

	/*
	 * Write a character device to it.
	 */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "tty0");
	archive_entry_set_mode(ae, S_IFCHR | 0600);
	archive_entry_set_size(ae, 0);
	archive_entry_set_rdev(ae, 1024);
	assertA(0 == archive_write_header(a, ae));
	archive_entry_free(ae);


	/* Close out the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Damage the second entry to test the search-ahead recovery.
	 * TODO: Move the damage-recovery checking to a separate test;
	 * it doesn't really belong in this write test.
	 */
	{
		int i;
		for (i = 80; i < 150; i++) {
			if (memcmp(buff + i, "07070", 5) == 0) {
				damaged = 1;
				buff[i] = 'X';
				break;
			}
		}
	}
	failure("Unable to locate the second header for damage-recovery test.");
	assert(damaged == 1);

	/*
	 * Now, read the data back.
	 */
	assert((a = archive_read_new()) != NULL);
	assertA(0 == archive_read_support_format_all(a));
	assertA(0 == archive_read_support_filter_all(a));
	assertA(0 == archive_read_open_memory(a, buff, used));

	if (!assertEqualIntA(a, 0, archive_read_next_header(a, &ae))) {
		archive_read_free(a);
		return;
	}

	assertEqualInt(1, archive_entry_mtime(ae));
	/* Not the same as above: cpio doesn't store hi-res times. */
	assert(0 == archive_entry_mtime_nsec(ae));
	assert(0 == archive_entry_atime(ae));
	assert(0 == archive_entry_ctime(ae));
	assertEqualString("file", archive_entry_pathname(ae));
	assertEqualInt((S_IFREG | 0755), archive_entry_mode(ae));
	assertEqualInt(8, archive_entry_size(ae));
	assertA(8 == archive_read_data(a, filedata, 10));
	assertEqualMem(filedata, "12345678", 8);

	/*
	 * The second file can't be read because we damaged its header.
	 */

	/*
	 * Read the third file back.
	 * ARCHIVE_WARN here because the damaged entry was skipped.
	 */
	assertEqualIntA(a, ARCHIVE_WARN, archive_read_next_header(a, &ae));
	assertEqualString("name", archive_entry_pathname(ae));

	/*
	 * Read the dir entry back.
	 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(11, archive_entry_mtime(ae));
	assert(0 == archive_entry_mtime_nsec(ae));
	assert(0 == archive_entry_atime(ae));
	assert(0 == archive_entry_ctime(ae));
	assertEqualString("dir", archive_entry_pathname(ae));
	assertEqualInt((S_IFDIR | 0755), archive_entry_mode(ae));
	assertEqualInt(0, archive_entry_size(ae));
	assertEqualIntA(a, 0, archive_read_data(a, filedata, 10));

	/*
	 * Read the character device entry back.
	 */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("tty0", archive_entry_pathname(ae));
	assertEqualInt((S_IFCHR | 0600), archive_entry_mode(ae));
	assertEqualInt(0, archive_entry_size(ae));
	assertEqualInt(1024, archive_entry_rdev(ae));

	/* Verify the end of the archive. */
	assertEqualIntA(a, 1, archive_read_next_header(a, &ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	free(buff);
}